

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

result_pair_type __thiscall
MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
exactMatchSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
          (DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
           *this,key_type *key,size_t len,size_t node_pos)

{
  int iVar1;
  uint uVar2;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *in_RDI;
  result_pair_type rVar3;
  int n;
  size_t i;
  uint p;
  int b;
  result_pair_type result;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_48;
  uint local_38;
  ulong local_28;
  result_pair_type local_10;
  
  local_28 = in_RDX;
  if (in_RDX == 0) {
    local_28 = Length<char>::operator()
                         ((Length<char> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (char *)in_RDI);
  }
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::set_result
            (in_RDI,&local_10,-1,0);
  local_38 = in_RDI->array_[in_RCX].base;
  for (local_48 = 0; local_48 < local_28; local_48 = local_48 + 1) {
    uVar2 = local_38 + *(byte *)(in_RSI + local_48) + 1;
    if (local_38 != in_RDI->array_[uVar2].check) goto LAB_001b8a34;
    local_38 = in_RDI->array_[uVar2].base;
  }
  iVar1 = in_RDI->array_[local_38].base;
  if ((local_38 == in_RDI->array_[local_38].check) && (iVar1 < 0)) {
    DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::set_result
              (in_RDI,&local_10,-1 - iVar1,local_28);
  }
LAB_001b8a34:
  rVar3._4_4_ = 0;
  rVar3.value = local_10.value;
  rVar3.length = local_10.length;
  return rVar3;
}

Assistant:

inline T exactMatchSearch(const key_type *key,
                            size_t len = 0,
                            size_t node_pos = 0) const {
    if (!len) len = length_func_()(key);

    T result;
    set_result(result, -1, 0);

    register array_type_  b = array_[node_pos].base;
    register array_u_type_ p;

    for (register size_t i = 0; i < len; ++i) {
      p = b +(node_u_type_)(key[i]) + 1;
      if (static_cast<array_u_type_>(b) == array_[p].check)
        b = array_[p].base;
      else
        return result;
    }

    p = b;
    array_type_ n = array_[p].base;
    if (static_cast<array_u_type_>(b) == array_[p].check && n < 0)
      set_result(result, -n-1, len);

    return result;
  }